

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsd.cpp
# Opt level: O2

image_char new_image_char_ini(uint xsize,uint ysize,uchar fill_value)

{
  uchar *puVar1;
  image_char piVar2;
  ulong uVar3;
  
  piVar2 = new_image_char(xsize,ysize);
  if ((piVar2 != (image_char)0x0) && (puVar1 = piVar2->data, puVar1 != (uchar *)0x0)) {
    for (uVar3 = 0; ysize * xsize != uVar3; uVar3 = uVar3 + 1) {
      puVar1[uVar3] = fill_value;
    }
    return piVar2;
  }
  error("new_image_char_ini: invalid image.");
}

Assistant:

image_char new_image_char_ini( unsigned int xsize, unsigned int ysize,
                               unsigned char fill_value )
{
    image_char image = new_image_char(xsize, ysize); /* create image */
    unsigned int N = xsize * ysize;
    unsigned int i;

    /* check parameters */
    if ( image == NULL || image->data == NULL )
        error("new_image_char_ini: invalid image.");

    /* initialize */
    for (i = 0; i < N; i++) image->data[i] = fill_value;

    return image;
}